

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O1

handle pybind11::detail::
       set_caster<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
       ::
       cast<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&>
                 (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *src,return_value_policy policy,handle parent)

{
  int iVar1;
  handle hVar2;
  _Hash_node_base *p_Var3;
  handle local_38;
  object value_;
  set s;
  
  set::set((set *)&value_);
  p_Var3 = (src->_M_h)._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      local_38 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ::cast((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (p_Var3 + 1),policy,parent);
      if (local_38.m_ptr == (PyObject *)0x0) {
LAB_002be36e:
        object::~object((object *)&local_38);
        hVar2.m_ptr = (PyObject *)0x0;
        goto LAB_002be379;
      }
      iVar1 = PySet_Add(value_.super_handle.m_ptr,local_38.m_ptr);
      if (iVar1 != 0) goto LAB_002be36e;
      object::~object((object *)&local_38);
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  hVar2 = value_.super_handle.m_ptr;
  value_.super_handle.m_ptr = (handle)(PyObject *)0x0;
LAB_002be379:
  object::~object(&value_);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Key>::policy(policy);
        pybind11::set s;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(key_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_ || !s.add(value_))
                return handle();
        }
        return s.release();
    }